

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

SQInteger persist_state(HSQUIRRELVM vm)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQObjectType SVar1;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  HSQOBJECT res;
  SQChar *slotName_1;
  bool isMutable;
  SQObjectType tp;
  HSQOBJECT mState;
  SQChar *slotName;
  HSQUIRRELVM in_stack_ffffffffffffff88;
  uint7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar3;
  HSQUIRRELVM in_stack_ffffffffffffff98;
  SQBool in_stack_ffffffffffffffb8;
  SQObjectValue in_stack_ffffffffffffffc0;
  SQObjectValue idx;
  HSQUIRRELVM in_stack_ffffffffffffffc8;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQRESULT local_8;
  
  sq_getstring(in_stack_ffffffffffffff98,
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (SQChar **)in_stack_ffffffffffffff88);
  sq_push((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
          (SQInteger)in_stack_ffffffffffffff88);
  SVar2 = sq_get_noerr(in_stack_ffffffffffffff98,
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  if (SVar2 < 0) {
    sq_getstackobj((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (SQInteger)in_stack_ffffffffffffff88,(HSQOBJECT *)0x1da7a3);
    sq_push((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
            (SQInteger)in_stack_ffffffffffffff88);
    sq_push((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
            (SQInteger)in_stack_ffffffffffffff88);
    SVar2 = sq_call(in_stack_ffffffffffffffd8,
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (SQBool)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0.nInteger);
    if (SVar2 < 0) {
      local_8 = sq_throwerror((HSQUIRRELVM)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              (SQChar *)in_stack_ffffffffffffff88);
    }
    else {
      SVar1 = sq_gettype((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (SQInteger)in_stack_ffffffffffffff88);
      uVar3 = true;
      if ((((SVar1 != OT_TABLE) && (uVar3 = true, SVar1 != OT_ARRAY)) &&
          (uVar3 = true, SVar1 != OT_USERDATA)) && (uVar3 = true, SVar1 != OT_CLASS)) {
        uVar3 = SVar1 == OT_INSTANCE;
      }
      if ((bool)uVar3 == false) {
        uVar4 = 0;
        SVar2 = sq_getstring(in_stack_ffffffffffffff98,(ulong)in_stack_ffffffffffffff90,
                             (SQChar **)in_stack_ffffffffffffff88);
        if (SVar2 == 0) {
          local_8 = sq_throwerror((HSQUIRRELVM)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                                  (SQChar *)in_stack_ffffffffffffff88);
        }
        else {
          local_8 = sqstd_throwerrorf(in_RDI,"Persist \'%s\' is not mutable, probably an error",
                                      uVar4);
        }
      }
      else {
        sq_getstackobj((HSQUIRRELVM)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                       (SQInteger)in_stack_ffffffffffffff88,(HSQOBJECT *)0x1da8e2);
        sq_addref((HSQUIRRELVM)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                  (HSQOBJECT *)in_stack_ffffffffffffff88);
        sq_pop((HSQUIRRELVM)CONCAT17(uVar3,in_stack_ffffffffffffff90),
               (SQInteger)in_stack_ffffffffffffff88);
        sq_push((HSQUIRRELVM)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                (SQInteger)in_stack_ffffffffffffff88);
        obj._unVal.pTable = in_stack_ffffffffffffffc0.pTable;
        obj._type = (int)in_stack_ffffffffffffffb8;
        obj._flags = (char)(in_stack_ffffffffffffffb8 >> 0x20);
        obj._5_3_ = (int3)(in_stack_ffffffffffffffb8 >> 0x28);
        idx = in_stack_ffffffffffffffc0;
        sq_pushobject((HSQUIRRELVM)in_stack_ffffffffffffffc0.pTable,obj);
        sq_newslot(in_stack_ffffffffffffffc8,idx.nInteger,in_stack_ffffffffffffffb8);
        obj_00._unVal.pTable = idx.pTable;
        obj_00._type = (int)in_stack_ffffffffffffffb8;
        obj_00._flags = (char)(in_stack_ffffffffffffffb8 >> 0x20);
        obj_00._5_3_ = (int3)(in_stack_ffffffffffffffb8 >> 0x28);
        sq_pushobject((HSQUIRRELVM)in_stack_ffffffffffffffc0.pTable,obj_00);
        sq_release(in_stack_ffffffffffffff88,(HSQOBJECT *)0x1da981);
        local_8 = 1;
      }
    }
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static SQInteger persist_state(HSQUIRRELVM vm)
{
  // arguments:
  // 1 - module 'this', 2 - slot id, 3 - intitializer, 4 - state storage
  SQRAT_ASSERT(sq_gettype(vm, 4) == OT_TABLE);

  const SQChar *slotName;
  sq_getstring(vm, 2, &slotName);

  sq_push(vm, 2); // slot id @ 5
  if (SQ_SUCCEEDED(sq_get_noerr(vm, 4)))
    return 1;

  HSQOBJECT mState;
  sq_getstackobj(vm, 4, &mState);

  sq_push(vm, 3); // initializer
  sq_push(vm, 1); // module 'this'
  if (SQ_FAILED(sq_call(vm, 1, SQTrue, SQTrue)))
    return sq_throwerror(vm, _SC("Failed to call initializer"));

  SQObjectType tp = sq_gettype(vm, -1);
  bool isMutable = tp==OT_TABLE || tp==OT_ARRAY || tp==OT_USERDATA || tp==OT_CLASS || tp==OT_INSTANCE;
  if (!isMutable)
  {
    const SQChar *slotName = nullptr;
    if (sq_getstring(vm, 2, &slotName))
      return sqstd_throwerrorf(vm, _SC("Persist '%s' is not mutable, probably an error"), slotName);
    else
      return sq_throwerror(vm, _SC("Persist is not mutable, probably an error"));
  }

  HSQOBJECT res;
  sq_getstackobj(vm, -1, &res);
  sq_addref(vm, &res);
  sq_pop(vm, 1); // initializer closure

  sq_push(vm, 2); // slot id
  sq_pushobject(vm, res); // initializer result
  sq_newslot(vm, 4, false);

  sq_pushobject(vm, res);
  sq_release(vm, &res);

  return 1;
}